

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

int Bmc_CollapseExpand2(sat_solver *pSat,sat_solver *pSatOn,Vec_Int_t *vLits,Vec_Int_t *vNums,
                       Vec_Int_t *vTemp,int nBTLimit,int fCanon,int fOnOffSetLit)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long nConfLimit;
  uint i;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int local_5c;
  
  iVar5 = -1;
  local_5c = -1;
  if (fCanon == 0) {
    if (-1 < fOnOffSetLit) {
      Vec_IntPush(vLits,fOnOffSetLit);
    }
    nConfLimit = (long)nBTLimit;
    iVar2 = sat_solver_solve(pSat,vLits->pArray,vLits->pArray + vLits->nSize,nConfLimit,0,0,0);
    if (-1 < fOnOffSetLit) {
      Vec_IntPop(vLits);
    }
    if (iVar2 == -1) {
      piVar1 = (pSat->conf_final).ptr;
      uVar6 = (pSat->conf_final).size;
      vNums->nSize = 0;
      vTemp->nSize = 0;
      if (-1 < fOnOffSetLit) {
        Vec_IntPush(vTemp,fOnOffSetLit);
      }
      iVar2 = 0;
      uVar9 = 0;
      if (0 < (int)uVar6) {
        uVar9 = (ulong)uVar6;
      }
      for (; iVar2 < vLits->nSize; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(vLits,iVar2);
        uVar7 = 0;
        while ((uVar8 = uVar9, uVar9 != uVar7 &&
               (iVar4 = Abc_LitNot(piVar1[uVar7]), uVar8 = uVar7, iVar3 != iVar4))) {
          uVar7 = uVar7 + 1;
        }
        if ((uint)uVar8 != uVar6) {
          Vec_IntPush(vNums,iVar2);
          Vec_IntPush(vTemp,iVar3);
        }
      }
      iVar2 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,nConfLimit,0,0,0);
      if (iVar2 == -1) {
        piVar1 = (pSat->conf_final).ptr;
        uVar6 = (pSat->conf_final).size;
        uVar9 = 0;
        if (0 < (int)uVar6) {
          uVar9 = (ulong)uVar6;
        }
        iVar5 = 0;
        for (iVar2 = 0; iVar2 < vTemp->nSize; iVar2 = iVar2 + 1) {
          iVar3 = Vec_IntEntry(vTemp,iVar2);
          if (iVar3 != fOnOffSetLit) {
            uVar7 = 0;
            while ((uVar8 = uVar9, uVar9 != uVar7 &&
                   (iVar4 = Abc_LitNot(piVar1[uVar7]), uVar8 = uVar7, iVar3 != iVar4))) {
              uVar7 = uVar7 + 1;
            }
            if ((uint)uVar8 != uVar6) {
              iVar3 = Vec_IntEntry(vNums,iVar2);
              Vec_IntWriteEntry(vNums,iVar5,iVar3);
              iVar5 = iVar5 + 1;
            }
          }
        }
        if (vNums->nSize < iVar5) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        vNums->nSize = iVar5;
        uVar6 = 0;
        do {
          while( true ) {
            if (iVar5 <= (int)uVar6) goto LAB_00460146;
            vTemp->nSize = 0;
            if (-1 < fOnOffSetLit) {
              Vec_IntPush(vTemp,fOnOffSetLit);
            }
            for (i = 0; (int)i < vNums->nSize; i = i + 1) {
              iVar5 = Vec_IntEntry(vNums,i);
              if (uVar6 != i) {
                iVar5 = Vec_IntEntry(vLits,iVar5);
                Vec_IntPush(vTemp,iVar5);
              }
            }
            iVar5 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,nConfLimit,0,0,
                                     0);
            if (iVar5 == 0) {
              return -1;
            }
            if (iVar5 == 1) break;
            if (vNums->nSize <= (int)uVar6) {
              __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x3ff,"void Vec_IntDrop(Vec_Int_t *, int)");
            }
            iVar5 = vNums->nSize + -1;
            vNums->nSize = iVar5;
            for (uVar9 = (ulong)uVar6; (int)uVar9 < iVar5; uVar9 = uVar9 + 1) {
              vNums->pArray[uVar9] = vNums->pArray[uVar9 + 1];
              iVar5 = vNums->nSize;
            }
          }
          iVar5 = vNums->nSize;
          uVar6 = uVar6 + 1;
        } while( true );
      }
      local_5c = iVar5;
      if (iVar2 != 0) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                      ,0x20c,
                      "int Bmc_CollapseExpand2(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                     );
      }
    }
    else if (iVar2 != 0) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                    ,0x1f2,
                    "int Bmc_CollapseExpand2(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                   );
    }
  }
  else {
    iVar2 = Bmc_CollapseExpandRound(pSat,pSatOn,vLits,vNums,vTemp,nBTLimit,fCanon,-1);
    local_5c = iVar5;
    if ((iVar2 != -1) &&
       (iVar2 = Bmc_CollapseExpandRound(pSat,(sat_solver *)0x0,vLits,vNums,vTemp,nBTLimit,fCanon,-1)
       , iVar2 != -1)) {
LAB_00460146:
      local_5c = 0;
    }
  }
  return local_5c;
}

Assistant:

int Bmc_CollapseExpand2( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit )
{
    // perform one quick reduction if it is non-canonical
    if ( !fCanon )
    {
        int i, k, iLit, j, iNum, status, nFinal, * pFinal;

        // check against offset
        if ( fOnOffSetLit >= 0 )
            Vec_IntPush( vLits, fOnOffSetLit );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( fOnOffSetLit >= 0 )
            Vec_IntPop( vLits );
        if ( status == l_Undef )
            return -1;
        assert( status == l_False );

        // get subset of literals
        nFinal = sat_solver_final( pSat, &pFinal );
        Vec_IntClear( vNums );
        Vec_IntClear( vTemp );
        if ( fOnOffSetLit >= 0 )
        {
            //Vec_IntPush( vNums, -1 );
            Vec_IntPush( vTemp, fOnOffSetLit );
        }
        Vec_IntForEachEntry( vLits, iLit, i )
        {
            for ( k = 0; k < nFinal; k++ )
                if ( iLit == Abc_LitNot(pFinal[k]) )
                    break;
            if ( k == nFinal )
                continue;
            Vec_IntPush( vNums, i );
            Vec_IntPush( vTemp, iLit );
        }

        // check against offset
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -1;
        assert( status == l_False );

        // get subset of literals
        nFinal = sat_solver_final( pSat, &pFinal );
        j = 0;
        Vec_IntForEachEntry( vTemp, iLit, i )
        {
            if ( iLit == fOnOffSetLit )
                continue;
            for ( k = 0; k < nFinal; k++ )
                if ( iLit == Abc_LitNot(pFinal[k]) )
                    break;
            if ( k == nFinal )
                continue;
            Vec_IntWriteEntry( vNums, j++, Vec_IntEntry(vNums, i) );
        }
        Vec_IntShrink( vNums, j );


        // try removing each literal
        for ( i = 0; i < Vec_IntSize(vNums); i++ )
        {
            Vec_IntClear( vTemp );
            if ( fOnOffSetLit >= 0 )
                Vec_IntPush( vTemp, fOnOffSetLit );
            Vec_IntForEachEntry( vNums, iNum, k )
                if ( k != i )
                    Vec_IntPush( vTemp, Vec_IntEntry(vLits, iNum) );
            // check against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef )
                return -1;
            if ( status == l_True )
                continue;
            // remove literal
            Vec_IntDrop( vNums, i );
            i--;
        }
    }
    else
    {
        if ( Bmc_CollapseExpandRound( pSat, pSatOn, vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
        if ( Bmc_CollapseExpandRound( pSat, NULL,   vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
    }
/*
    {
        // put into new array
        int i, iLit;
        Vec_IntClear( vNums );
        Vec_IntForEachEntry( vLits, iLit, i )
            if ( iLit != -1 )
                Vec_IntPush( vNums, i );
        //printf( "%d(%d) ", Vec_IntSize(vNums), Vec_IntSize(vLits) );
    }
*/
    return 0;
}